

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O0

Rect __thiscall lunasvg::SVGElement::paintBoundingBox(SVGElement *this)

{
  bool bVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  Rect RVar2;
  Rect local_50;
  Rect local_40 [2];
  SVGElement *local_20;
  SVGElement *this_local;
  undefined8 local_10;
  
  local_20 = this;
  bVar1 = Rect::isValid(&this->m_paintBoundingBox);
  if (bVar1) {
    this_local = *(SVGElement **)&this->m_paintBoundingBox;
    local_10._0_4_ = (this->m_paintBoundingBox).w;
    local_10._4_4_ = (this->m_paintBoundingBox).h;
  }
  else {
    (this->m_paintBoundingBox).x = 0.0;
    (this->m_paintBoundingBox).y = 0.0;
    (this->m_paintBoundingBox).w = 0.0;
    (this->m_paintBoundingBox).h = 0.0;
    (*(this->super_SVGNode)._vptr_SVGNode[0xc])();
    (this->m_paintBoundingBox).x = (float)extraout_XMM0_Da;
    (this->m_paintBoundingBox).y = (float)extraout_XMM0_Db;
    (this->m_paintBoundingBox).w = (float)(int)in_XMM1_Qa;
    (this->m_paintBoundingBox).h = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
    bVar1 = Rect::isValid(&this->m_paintBoundingBox);
    if (!bVar1) {
      __assert_fail("m_paintBoundingBox.isValid()",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgelement.cpp"
                    ,0x141,"virtual Rect lunasvg::SVGElement::paintBoundingBox() const");
    }
    if (this->m_clipper != (SVGClipPathElement *)0x0) {
      RVar2 = SVGClipPathElement::clipBoundingBox(this->m_clipper,this);
      local_40[0]._8_8_ = RVar2._8_8_;
      local_40[0]._0_8_ = RVar2._0_8_;
      Rect::intersect(&this->m_paintBoundingBox,local_40);
    }
    if (this->m_masker != (SVGMaskElement *)0x0) {
      RVar2 = SVGMaskElement::maskBoundingBox(this->m_masker,this);
      local_50._8_8_ = RVar2._8_8_;
      local_50._0_8_ = RVar2._0_8_;
      Rect::intersect(&this->m_paintBoundingBox,&local_50);
    }
    this_local = *(SVGElement **)&this->m_paintBoundingBox;
    local_10._0_4_ = (this->m_paintBoundingBox).w;
    local_10._4_4_ = (this->m_paintBoundingBox).h;
  }
  RVar2.w = (float)(undefined4)local_10;
  RVar2.h = (float)local_10._4_4_;
  RVar2._0_8_ = this_local;
  return RVar2;
}

Assistant:

Rect SVGElement::paintBoundingBox() const
{
    if(m_paintBoundingBox.isValid())
        return m_paintBoundingBox;
    m_paintBoundingBox = Rect::Empty;
    m_paintBoundingBox = strokeBoundingBox();
    assert(m_paintBoundingBox.isValid());
    if(m_clipper) m_paintBoundingBox.intersect(m_clipper->clipBoundingBox(this));
    if(m_masker) m_paintBoundingBox.intersect(m_masker->maskBoundingBox(this));
    return m_paintBoundingBox;
}